

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_length.cpp
# Opt level: O1

int ON_ParseLengthExpression
              (wchar_t *str,int str_count,ON_ParseSettings parse_settings,
              LengthUnitSystem length_value_unit_system,double *length_value,
              ON_ParseSettings *parse_results,LengthUnitSystem *str_length_unit_system)

{
  ON__UINT32 aOVar1 [2];
  ON__UINT32 aOVar2 [2];
  ON__UINT16 OVar3;
  ON__UINT8 OVar4;
  ON__UINT8 OVar5;
  ON__UINT64 OVar6;
  int iVar7;
  undefined7 in_register_00000011;
  double dVar8;
  LengthUnitSystem us;
  double x;
  LengthUnitSystem local_29;
  double local_28;
  
  local_29 = None;
  if ((int)CONCAT71(in_register_00000011,length_value_unit_system) == 0xb) {
    if (str_length_unit_system != (LengthUnitSystem *)0x0) {
      *str_length_unit_system = None;
    }
    if (length_value != (double *)0x0) {
      *length_value = -1.23432101234321e+308;
    }
    OVar6 = ON_ParseSettings::FalseSettings.m_reserved;
    aOVar2 = ON_ParseSettings::FalseSettings.m_false_default_bits;
    aOVar1 = ON_ParseSettings::FalseSettings.m_true_default_bits;
    iVar7 = 0;
    if (parse_results != (ON_ParseSettings *)0x0) {
      OVar3 = ON_ParseSettings::FalseSettings.m_context_locale_id;
      OVar4 = ON_ParseSettings::FalseSettings.m_context_angle_unit_system;
      OVar5 = ON_ParseSettings::FalseSettings.m_context_length_unit_system;
      parse_results->m_reserved_bits = ON_ParseSettings::FalseSettings.m_reserved_bits;
      parse_results->m_context_locale_id = OVar3;
      parse_results->m_context_angle_unit_system = OVar4;
      parse_results->m_context_length_unit_system = OVar5;
      parse_results->m_reserved = OVar6;
      *&parse_results->m_true_default_bits = aOVar1;
      *&parse_results->m_false_default_bits = aOVar2;
      iVar7 = 0;
    }
  }
  else {
    local_28 = -1.23432101234321e+308;
    iVar7 = ON_ParseLengthExpression(str,str_count,parse_settings,&local_28,parse_results,&local_29)
    ;
    if ((((0 < iVar7) && (local_29 != None)) && (length_value_unit_system != None)) &&
       (local_29 != length_value_unit_system)) {
      dVar8 = ON::UnitScale(local_29,length_value_unit_system);
      local_28 = dVar8 * local_28;
    }
    if (str_length_unit_system != (LengthUnitSystem *)0x0) {
      *str_length_unit_system = local_29;
    }
    if (length_value != (double *)0x0) {
      *length_value = local_28;
    }
  }
  return iVar7;
}

Assistant:

int ON_ParseLengthExpression( 
  const wchar_t* str,
  int str_count,
  ON_ParseSettings parse_settings,
  ON::LengthUnitSystem length_value_unit_system,
  double* length_value,
  ON_ParseSettings* parse_results,
  ON::LengthUnitSystem* str_length_unit_system
  )
{
  ON::LengthUnitSystem us = ON::LengthUnitSystem::None;

  if ( ON::LengthUnitSystem::CustomUnits == length_value_unit_system )
  {
    // must use the ON_UnitSystem override for custom units.
    if ( 0 != str_length_unit_system )
      *str_length_unit_system = us;
    if ( 0 != length_value )
      *length_value = ON_UNSET_VALUE;
    if ( 0 != parse_results )
      *parse_results = ON_ParseSettings::FalseSettings;
    return 0; 
  }
  
  double x = ON_UNSET_VALUE;
  int parsed_element_count = ON_ParseLengthExpression(
    str,
    str_count,
    parse_settings,
    &x,
    parse_results,
    &us
    );

  if ( parsed_element_count > 0 )
  {
    if (    us != length_value_unit_system 
         && ON::LengthUnitSystem::None != length_value_unit_system
         && ON::LengthUnitSystem::None != us
         )
    {
      double s = ON::UnitScale(us,length_value_unit_system);
      x *= s;
    }
  }

  if ( 0 != str_length_unit_system )
    *str_length_unit_system = us;
  if ( 0 != length_value )
    *length_value = x;

  return parsed_element_count;
}